

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

void __thiscall IRBuilder::BuildConstantLoads(IRBuilder *this)

{
  undefined1 *puVar1;
  code *pcVar2;
  bool bVar3;
  RegSlot RVar4;
  TypeId typeId;
  JITTimeFunctionBody *pJVar5;
  undefined4 *puVar6;
  intptr_t varConst;
  RegOpnd *dstOpnd;
  ValueType *pVVar7;
  Instr *instr;
  Func *func;
  RegSlot location;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType valueType;
  
  pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  RVar4 = JITTimeFunctionBody::GetConstCount(pJVar5);
  if (1 < RVar4) {
    location = 1;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      varConst = JITTimeFunctionBody::GetConstantVar(pJVar5,location);
      if (varConst == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0x589,"(varConst != 0)","varConst != 0");
        if (!bVar3) goto LAB_004c432c;
        *puVar6 = 0;
      }
      pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      typeId = JITTimeFunctionBody::GetConstantType(pJVar5,location);
      dstOpnd = BuildDstOpnd(this,location,TyVar,false,false);
      pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      bVar3 = JITTimeFunctionBody::RegIsConstant(pJVar5,location);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0x58d,"(this->RegIsConstant(reg))","this->RegIsConstant(reg)");
        if (!bVar3) {
LAB_004c432c:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
      puVar1 = &dstOpnd->m_sym->field_0x18;
      *(uint *)puVar1 = *(uint *)puVar1 | 0x40000;
      ValueType::ValueType((ValueType *)&local_32[0].field_0);
      if (typeId == TypeIds_Limit) {
        typeId = TypeIds_Limit;
LAB_004c42dc:
        local_32[0].field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::FromTypeId(typeId,false);
        func = this->m_func;
      }
      else {
        if (typeId == TypeIds_String) {
          pVVar7 = &ValueType::String;
        }
        else {
          if (typeId != TypeIds_Number) goto LAB_004c42dc;
          pVVar7 = &ValueType::Number;
        }
        local_32[0] = (anon_union_2_4_ea848c7b_for_ValueType_13)pVVar7->field_0;
        func = this->m_func;
      }
      instr = IR::Instr::NewConstantLoad
                        (dstOpnd,varConst,(ValueType)local_32[0].field_0,func,(Var)0x0);
      AddInstr(this,instr,0xffffffff);
      location = location + 1;
    } while (RVar4 != location);
  }
  return;
}

Assistant:

void
IRBuilder::BuildConstantLoads()
{
    Js::RegSlot count = m_func->GetJITFunctionBody()->GetConstCount();

    for (Js::RegSlot reg = Js::FunctionBody::FirstRegSlot; reg < count; reg++)
    {
        intptr_t varConst = m_func->GetJITFunctionBody()->GetConstantVar(reg);
        Assert(varConst != 0);
        Js::TypeId type = m_func->GetJITFunctionBody()->GetConstantType(reg);

        IR::RegOpnd *dstOpnd = this->BuildDstOpnd(reg);
        Assert(this->RegIsConstant(reg));
        dstOpnd->m_sym->SetIsFromByteCodeConstantTable();
        // TODO: be more precise about this
        ValueType valueType;
        IR::Instr *instr = nullptr;
        switch (type)
        {
        case Js::TypeIds_Number:
            valueType = ValueType::Number;
            instr = IR::Instr::NewConstantLoad(dstOpnd, varConst, valueType, m_func
#if !FLOATVAR
                , m_func->IsOOPJIT() ? m_func->GetJITFunctionBody()->GetConstAsT<Js::JavascriptNumber>(reg) : nullptr
#endif
            );
            break;
        case Js::TypeIds_String:
        {
            valueType = ValueType::String;
            if (m_func->IsOOPJIT())
            {
                // must be either PropertyString or LiteralString
                JITRecyclableObject * jitObj = m_func->GetJITFunctionBody()->GetConstantContent(reg);
                JITJavascriptString * constStr = JITJavascriptString::FromVar(jitObj);
                instr = IR::Instr::NewConstantLoad(dstOpnd, varConst, valueType, m_func, constStr);
            }
            else
            {
                instr = IR::Instr::NewConstantLoad(dstOpnd, varConst, valueType, m_func);
            }
            break;
        }
        case Js::TypeIds_Limit:
            valueType = ValueType::FromTypeId(type, false);
            instr = IR::Instr::NewConstantLoad(dstOpnd, varConst, valueType, m_func);
            break;
        default:
            valueType = ValueType::FromTypeId(type, false);
            instr = IR::Instr::NewConstantLoad(dstOpnd, varConst, valueType, m_func,
                m_func->IsOOPJIT() ? m_func->GetJITFunctionBody()->GetConstAsT<Js::RecyclableObject>(reg) : nullptr);
            break;
        }        
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);
    }

}